

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_end(nk_context *ctx)

{
  nk_panel *in_RDI;
  nk_context *unaff_retaddr;
  nk_panel *layout;
  nk_context *in_stack_000000f0;
  
  if ((in_RDI != (nk_panel *)0x0) && (in_RDI[0x25].offset_x != (nk_uint *)0x0)) {
    if ((*(int **)(in_RDI[0x25].offset_x + 0x2a) == (int *)0x0) ||
       ((**(int **)(in_RDI[0x25].offset_x + 0x2a) == 1 &&
        ((in_RDI[0x25].offset_x[0x12] & 0x2000) != 0)))) {
      in_RDI[0x25].offset_x = (nk_uint *)0x0;
    }
    else {
      nk_panel_end(in_stack_000000f0);
      nk_free_panel(unaff_retaddr,in_RDI);
      in_RDI[0x25].offset_x = (nk_uint *)0x0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
struct nk_panel *layout;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
if (!ctx || !ctx->current)
return;

layout = ctx->current->layout;
if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
ctx->current = 0;
return;
}
nk_panel_end(ctx);
nk_free_panel(ctx, ctx->current->layout);
ctx->current = 0;
}